

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fs_write_alotof_bufs_with_offset(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  char *__ptr_00;
  undefined8 uVar4;
  void *unaff_RBX;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  uv_buf_t uVar9;
  undefined1 auStack_52 [2];
  code *pcStack_50;
  undefined8 local_48;
  long local_38;
  
  pcStack_50 = (code *)0x161f6d;
  unlink("test_file");
  pcStack_50 = (code *)0x161f72;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_50 = (code *)0x161f83;
  __ptr = malloc(0xd4310);
  if (__ptr == (void *)0x0) {
LAB_001622cf:
    __ptr = unaff_RBX;
    pcStack_50 = (code *)0x1622d4;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_001622d4:
    pcStack_50 = (code *)0x1622d9;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_001622d9:
    pcStack_50 = (code *)0x1622de;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_001622de:
    pcStack_50 = (code *)0x1622e3;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_001622e3:
    pcStack_50 = (code *)0x1622e8;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_001622e8:
    pcStack_50 = (code *)0x1622ed;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_001622ed:
    pcStack_50 = (code *)0x1622f2;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_001622f2:
    pcStack_50 = (code *)0x1622f7;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_001622f7:
    pcStack_50 = (code *)0x1622fc;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_001622fc:
    pcStack_50 = (code *)0x162301;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00162301:
    pcStack_50 = (code *)0x162306;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00162306:
    pcStack_50 = (code *)0x16230b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0016230b:
    pcStack_50 = (code *)0x162310;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00162310:
    pcStack_50 = (code *)0x162315;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00162315:
    pcStack_50 = (code *)0x16231a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_50 = (code *)0x161fb2;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_001622d4;
    if (open_req1.result._4_4_ < 0) goto LAB_001622d9;
    pcStack_50 = (code *)0x161fd4;
    uv_fs_req_cleanup(&open_req1);
    pcStack_50 = (code *)0x161fe5;
    iov = (uv_buf_t)uv_buf_init("0123456789",10);
    local_48 = 0;
    pcStack_50 = (code *)0x162023;
    iVar2 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_001622de;
    if (write_req.result != 10) goto LAB_001622e3;
    pcStack_50 = (code *)0x162048;
    uv_fs_req_cleanup(&write_req);
    lVar7 = 8;
    do {
      pcStack_50 = (code *)0x162062;
      auVar8 = uv_buf_init(test_buf,0xd);
      *(long *)((long)__ptr + lVar7 + -8) = auVar8._0_8_;
      *(long *)((long)__ptr + lVar7) = auVar8._8_8_;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0xd4318);
    local_48 = 0;
    pcStack_50 = (code *)0x1620a3;
    iVar2 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,__ptr,0xd431,10);
    if (iVar2 < 0) goto LAB_001622e8;
    if (write_req.result != 0xac67d) goto LAB_001622ed;
    pcStack_50 = (code *)0x1620c8;
    uv_fs_req_cleanup(&write_req);
    pcStack_50 = (code *)0x1620d2;
    __ptr_00 = (char *)malloc(0xac67d);
    if (__ptr_00 == (char *)0x0) goto LAB_001622f2;
    lVar7 = 8;
    pcVar5 = __ptr_00;
    do {
      pcStack_50 = (code *)0x1620f4;
      auVar8 = uv_buf_init(pcVar5,0xd);
      *(long *)((long)__ptr + lVar7 + -8) = auVar8._0_8_;
      *(long *)((long)__ptr + lVar7) = auVar8._8_8_;
      lVar7 = lVar7 + 0x10;
      pcVar5 = pcVar5 + 0xd;
    } while (lVar7 != 0xd4318);
    local_48 = 0;
    pcStack_50 = (code *)0x162136;
    iVar2 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,__ptr,0xd431,10);
    if (iVar2 < 0) goto LAB_001622f7;
    local_38 = 10;
    lVar7 = 0xd;
    if (iVar2 != 0xd) {
      lVar7 = 0x3400;
    }
    if (read_req.result != lVar7) goto LAB_001622fc;
    pcVar5 = __ptr_00;
    uVar6 = 0;
    do {
      pcStack_50 = (code *)0x162180;
      iVar3 = strncmp(pcVar5,test_buf,0xd);
      if (iVar3 != 0) {
        pcStack_50 = (code *)0x1622cf;
        fs_write_alotof_bufs_with_offset_cold_9();
        unaff_RBX = __ptr;
        goto LAB_001622cf;
      }
      if (iVar2 == 0xd) break;
      pcVar5 = pcVar5 + 0xd;
      bVar1 = uVar6 < 0x3ff;
      uVar6 = uVar6 + 1;
    } while (bVar1);
    pcStack_50 = (code *)0x1621ad;
    uv_fs_req_cleanup(&read_req);
    pcStack_50 = (code *)0x1621b5;
    free(__ptr_00);
    pcStack_50 = (code *)0x1621cc;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar7 = local_38;
    if (iVar2 != 0) goto LAB_00162301;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + local_38) goto LAB_00162306;
    pcStack_50 = (code *)0x162200;
    uv_fs_req_cleanup(&stat_req);
    pcStack_50 = (code *)0x162211;
    uVar9 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_48 = 0;
    pcStack_50 = (code *)0x162252;
    iov = uVar9;
    iVar2 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,lVar7 + write_req.result);
    if (iVar2 != 0) goto LAB_0016230b;
    if (read_req.result != 0) goto LAB_00162310;
    pcStack_50 = (code *)0x162274;
    uv_fs_req_cleanup(&read_req);
    pcStack_50 = (code *)0x16228a;
    iVar2 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00162315;
    if (close_req.result == 0) {
      pcStack_50 = (code *)0x1622a8;
      uv_fs_req_cleanup(&close_req);
      pcStack_50 = (code *)0x1622b4;
      unlink("test_file");
      free(__ptr);
      return;
    }
  }
  pcStack_50 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_50 = (code *)__ptr;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00162496;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_0016249b;
    uv_fs_req_cleanup(&open_req1);
    uVar9 = (uv_buf_t)uv_buf_init(auStack_52,2);
    iov = uVar9;
    iVar2 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_001624a0;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001624aa;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00162496:
    run_test_fs_read_dir_cold_2();
LAB_0016249b:
    run_test_fs_read_dir_cold_3();
LAB_001624a0:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001624aa:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_alotof_bufs_with_offset(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;
  int64_t offset;
  char* filler;
  int filler_len;

  filler = "0123456789";
  filler_len = strlen(filler);
  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(filler, filler_len);
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == filler_len);
  ASSERT(write_req.result == filler_len);
  uv_fs_req_cleanup(&write_req);
  offset = (int64_t)r;

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  offset,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_read(NULL, &read_req, open_req1.result,
                 iovs, iovcount, offset, NULL);
  ASSERT(r >= 0);
  if (r == sizeof(test_buf))
    iovcount = 1; /* Infer that preadv is not available. */
  else if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  r = uv_fs_stat(NULL, &stat_req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT((int64_t)((uv_stat_t*)stat_req.ptr)->st_size ==
         offset + (int64_t)write_req.result);
  uv_fs_req_cleanup(&stat_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 offset + write_req.result,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}